

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

void Func::Codegen(JitArenaAllocator *alloc,JITTimeWorkItem *workItem,
                  ThreadContextInfo *threadContextInfo,ScriptContextInfo *scriptContextInfo,
                  JITOutputIDL *outputData,EntryPointInfo *epInfo,
                  FunctionJITRuntimeInfo *runtimeInfo,
                  JITTimePolymorphicInlineCacheInfo *polymorphicInlineCacheInfo,
                  void *codeGenAllocators,ScriptContextProfiler *codeGenProfiler,
                  bool isBackgroundJIT)

{
  char16 debugStringBuffer [42];
  Func func;
  
  func.m_lazyBailOutRecordSlot = (StackSym *)epInfo;
  __tls_get_addr(&PTR_01548f08);
  Func((Func *)(debugStringBuffer + 0x28),alloc,workItem,threadContextInfo,scriptContextInfo,
       outputData,(EntryPointInfo *)func.m_lazyBailOutRecordSlot,runtimeInfo,
       polymorphicInlineCacheInfo,codeGenAllocators,codeGenProfiler,isBackgroundJIT,(Func *)0x0,
       0xffffffff,0xffffffff,false,0xffff,false);
  TryCodegen((Func *)(debugStringBuffer + 0x28));
  SList<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>::~SList
            ((SList<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)
             &func.m_globalObjTypeSpecFldInfoArray);
  NativeCodeData::Allocator::~Allocator((Allocator *)&func.nativeCodeDataAllocator.isOOPJIT);
  NativeCodeData::Allocator::~Allocator((Allocator *)&func.m_cloneMap);
  func.byteCodeRegisterUses = (ByteCodeRegisterUses *)&PTR_IsReadOnly_014d50d0;
  if (func.currentPhases.list.super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>
      ._vptr_ReadOnlyList != (_func_int **)0x0) {
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
               func.currentPhases.list.
               super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>._16_8_,
               func.currentPhases.list.
               super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>.
               _vptr_ReadOnlyList,
               (long)(int)func.currentPhases.list.
                          super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>.
                          alloc * 2);
    func.currentPhases.list.super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>.
    _vptr_ReadOnlyList = (_func_int **)0x0;
    func.currentPhases.list.super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>.
    buffer._0_4_ = 0;
    func.currentPhases.list.super_ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>.
    alloc._0_4_ = 0;
  }
  JsUtil::
  BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     *)&func.propertiesWrittenTo);
  return;
}

Assistant:

void
Func::Codegen(JitArenaAllocator *alloc, JITTimeWorkItem * workItem,
    ThreadContextInfo * threadContextInfo,
    ScriptContextInfo * scriptContextInfo,
    JITOutputIDL * outputData,
    Js::EntryPointInfo* epInfo, // for in-proc jit only
    const FunctionJITRuntimeInfo *const runtimeInfo,
    JITTimePolymorphicInlineCacheInfo * const polymorphicInlineCacheInfo, void * const codeGenAllocators,
#if !FLOATVAR
    CodeGenNumberAllocator * numberAllocator,
#endif
    Js::ScriptContextProfiler *const codeGenProfiler, const bool isBackgroundJIT)
{
    bool rejit;
    int rejitCounter = 0;
    do
    {
        Assert(rejitCounter < 25);
        Func func(alloc, workItem, threadContextInfo,
            scriptContextInfo, outputData, epInfo, runtimeInfo,
            polymorphicInlineCacheInfo, codeGenAllocators, 
#if !FLOATVAR
            numberAllocator,
#endif
            codeGenProfiler, isBackgroundJIT);
        try
        {
            func.TryCodegen();
            rejit = false;
        }
        catch (Js::RejitException ex)
        {
            // The work item needs to be rejitted, likely due to some optimization that was too aggressive
            switch (ex.Reason())
            {
            case RejitReason::AggressiveIntTypeSpecDisabled:
                outputData->disableAggressiveIntTypeSpec = TRUE;
                break;
            case RejitReason::InlineApplyDisabled:
                workItem->GetJITFunctionBody()->DisableInlineApply();
                outputData->disableInlineApply = TRUE;
                break;
            case RejitReason::InlineSpreadDisabled:
                workItem->GetJITFunctionBody()->DisableInlineSpread();
                outputData->disableInlineSpread = TRUE;
                break;
            case RejitReason::DisableStackArgOpt:
                outputData->disableStackArgOpt = TRUE;
                break;
            case RejitReason::DisableStackArgLenAndConstOpt:
                break;
            case RejitReason::DisableSwitchOptExpectingInteger:
            case RejitReason::DisableSwitchOptExpectingString:
                outputData->disableSwitchOpt = TRUE;
                break;
            case RejitReason::ArrayCheckHoistDisabled:
            case RejitReason::ArrayAccessHelperCallEliminationDisabled:
                outputData->disableArrayCheckHoist = TRUE;
                break;
            case RejitReason::TrackIntOverflowDisabled:
                outputData->disableTrackCompoundedIntOverflow = TRUE;
                break;
            case RejitReason::MemOpDisabled:
                outputData->disableMemOp = TRUE;
                break;
            case RejitReason::FailedEquivalentTypeCheck:
                // No disable flag. The thrower of the re-jit exception must guarantee that objtypespec is disabled where appropriate.
                break;
            default:
                Assume(UNREACHED);
            }

            if (PHASE_TRACE(Js::ReJITPhase, &func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(
                    _u("Rejit (compile-time): function: %s (%s) reason: %S\n"),
                    workItem->GetJITFunctionBody()->GetDisplayName(),
                    workItem->GetJITTimeInfo()->GetDebugNumberSet(debugStringBuffer),
                    ex.ReasonName());
            }

            rejit = true;
            rejitCounter++;
        }
        // Either the entry point has a reference to the number now, or we failed to code gen and we
        // don't need to numbers, we can flush the completed page now.
        //
        // If the number allocator is NULL then we are shutting down the thread context and so too the
        // code generator. The number allocator must be freed before the recycler (and thus before the
        // code generator) so we can't and don't need to flush it.

        // TODO: OOP JIT, allocator cleanup
    } while (rejit);
}